

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O3

int smf_get_length_pulses(smf_t *smf)

{
  smf_track_t *track;
  smf_event_t *psVar1;
  int iVar2;
  int track_number;
  
  if (smf->number_of_tracks < 1) {
    iVar2 = 0;
  }
  else {
    track_number = 0;
    iVar2 = 0;
    do {
      track_number = track_number + 1;
      track = smf_get_track_by_number(smf,track_number);
      if (track == (smf_track_t *)0x0) {
        __assert_fail("track",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                      ,0x418,"int smf_get_length_pulses(const smf_t *)");
      }
      if (((track->number_of_events != 0) &&
          (psVar1 = smf_track_get_event_by_number(track,track->number_of_events),
          psVar1 != (smf_event_t *)0x0)) && (iVar2 < psVar1->time_pulses)) {
        iVar2 = psVar1->time_pulses;
      }
    } while (track_number < smf->number_of_tracks);
  }
  return iVar2;
}

Assistant:

int
smf_get_length_pulses(const smf_t *smf)
{
	int pulses = 0, i;

	for (i = 1; i <= smf->number_of_tracks; i++) {
		smf_track_t *track;
		smf_event_t *event;

	       	track = smf_get_track_by_number(smf, i);
		assert(track);

		event = smf_track_get_last_event(track);
		/* Empty track? */
		if (event == NULL)
			continue;

		if (event->time_pulses > pulses)
			pulses = event->time_pulses;
	}

	return (pulses);
}